

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitMemberAccessExpression
          (SyntaxDumper *this,MemberAccessExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  traverseExpression(this,&node->super_ExpressionSyntax);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->oprtrTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->memberName_);
  return Skip;
}

Assistant:

virtual Action visitMemberAccessExpression(const MemberAccessExpressionSyntax* node) override
    {
        traverseExpression(node);
        nonterminal(node->expression());
        terminal(node->operatorToken(), node);
        nonterminal(node->memberName());
        return Action::Skip;
    }